

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalStart(Fts3Cursor *pCsr)

{
  Fts3Expr **local_50;
  Fts3Expr **ppOr;
  Fts3TokenAndCost *pTC;
  Fts3Expr **ppFStack_38;
  int ii;
  Fts3Expr **apOr;
  Fts3TokenAndCost *aTC;
  int local_20;
  int nOr;
  int nToken;
  int rc;
  Fts3Table *pTab;
  Fts3Cursor *pCsr_local;
  
  _nToken = (pCsr->base).pVtab;
  nOr = 0;
  local_20 = 0;
  aTC._4_4_ = 0;
  pTab = (Fts3Table *)pCsr;
  fts3EvalAllocateReaders(pCsr,pCsr->pExpr,&local_20,(int *)((long)&aTC + 4),&nOr);
  if (((nOr == 0) && (1 < local_20)) && (*(char *)((long)&_nToken[0x12].zErrMsg + 4) != '\0')) {
    apOr = (Fts3Expr **)sqlite3_malloc64((long)local_20 * 0x28 + (long)aTC._4_4_ * 0x10);
    ppFStack_38 = apOr + (long)local_20 * 5;
    if (apOr == (Fts3Expr **)0x0) {
      nOr = 7;
    }
    else {
      local_50 = ppFStack_38;
      ppOr = apOr;
      fts3EvalTokenCosts((Fts3Cursor *)pTab,(Fts3Expr *)0x0,(Fts3Expr *)pTab->db,
                         (Fts3TokenAndCost **)&ppOr,&local_50,&nOr);
      local_20 = (int)(((long)ppOr - (long)apOr) / 0x28);
      aTC._4_4_ = (int)((long)local_50 - (long)ppFStack_38 >> 3);
      if (nOr == 0) {
        nOr = fts3EvalSelectDeferred
                        ((Fts3Cursor *)pTab,(Fts3Expr *)0x0,(Fts3TokenAndCost *)apOr,local_20);
        for (pTC._4_4_ = 0; nOr == 0 && pTC._4_4_ < aTC._4_4_; pTC._4_4_ = pTC._4_4_ + 1) {
          nOr = fts3EvalSelectDeferred
                          ((Fts3Cursor *)pTab,ppFStack_38[pTC._4_4_],(Fts3TokenAndCost *)apOr,
                           local_20);
        }
      }
      sqlite3_free(apOr);
    }
  }
  fts3EvalStartReaders((Fts3Cursor *)pTab,(Fts3Expr *)pTab->db,&nOr);
  return nOr;
}

Assistant:

static int fts3EvalStart(Fts3Cursor *pCsr){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;
  int nToken = 0;
  int nOr = 0;

  /* Allocate a MultiSegReader for each token in the expression. */
  fts3EvalAllocateReaders(pCsr, pCsr->pExpr, &nToken, &nOr, &rc);

  /* Determine which, if any, tokens in the expression should be deferred. */
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
  if( rc==SQLITE_OK && nToken>1 && pTab->bFts4 ){
    Fts3TokenAndCost *aTC;
    Fts3Expr **apOr;
    aTC = (Fts3TokenAndCost *)sqlite3_malloc64(
        sizeof(Fts3TokenAndCost) * nToken
      + sizeof(Fts3Expr *) * nOr * 2
    );
    apOr = (Fts3Expr **)&aTC[nToken];

    if( !aTC ){
      rc = SQLITE_NOMEM;
    }else{
      int ii;
      Fts3TokenAndCost *pTC = aTC;
      Fts3Expr **ppOr = apOr;

      fts3EvalTokenCosts(pCsr, 0, pCsr->pExpr, &pTC, &ppOr, &rc);
      nToken = (int)(pTC-aTC);
      nOr = (int)(ppOr-apOr);

      if( rc==SQLITE_OK ){
        rc = fts3EvalSelectDeferred(pCsr, 0, aTC, nToken);
        for(ii=0; rc==SQLITE_OK && ii<nOr; ii++){
          rc = fts3EvalSelectDeferred(pCsr, apOr[ii], aTC, nToken);
        }
      }

      sqlite3_free(aTC);
    }
  }
#endif

  fts3EvalStartReaders(pCsr, pCsr->pExpr, &rc);
  return rc;
}